

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::TexSubImageCubeArrayDepthCase::TexSubImageCubeArrayDepthCase
          (TexSubImageCubeArrayDepthCase *this,Context *context,char *name,char *desc,
          deUint32 internalFormat,int imageSize,int numLayers)

{
  TextureFormatInfo *pTVar1;
  uint uVar2;
  TextureFormat local_38;
  
  local_38 = glu::mapGLInternalFormat(internalFormat);
  uVar2 = 0x20;
  if (imageSize != 0) {
    uVar2 = 0x1f;
    if (imageSize != 0) {
      for (; (uint)imageSize >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  TextureCubeArraySpecCase::TextureCubeArraySpecCase
            (&this->super_TextureCubeArraySpecCase,context,name,desc,&local_38,imageSize,numLayers,
             0x20 - uVar2);
  (this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__TextureCubeArraySpecCase_00a12130;
  *(deUint32 *)&(this->super_TextureCubeArraySpecCase).field_0xd4 = internalFormat;
  (this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupBias.m_data[0] = 0.25;
  (this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupBias.m_data[1] = 0.0;
  pTVar1 = &(this->super_TextureCubeArraySpecCase).m_texFormatInfo;
  (pTVar1->lookupBias).m_data[2] = 0.0;
  (pTVar1->lookupBias).m_data[3] = 1.0;
  (this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupScale.m_data[0] = 0.5;
  (this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupScale.m_data[1] = 1.0;
  pTVar1 = &(this->super_TextureCubeArraySpecCase).m_texFormatInfo;
  (pTVar1->lookupScale).m_data[2] = 1.0;
  (pTVar1->lookupScale).m_data[3] = 0.0;
  return;
}

Assistant:

TexSubImageCubeArrayDepthCase (Context&		context,
								 const char*	name,
								 const char*	desc,
								 deUint32		internalFormat,
								 int			imageSize,
								 int			numLayers)
		: TextureCubeArraySpecCase(context, name, desc, glu::mapGLInternalFormat(internalFormat), imageSize, numLayers, maxLevelCount(imageSize))
		, m_internalFormat		(internalFormat)
	{
		// we are interested in the behavior near [-2, 2], map it to visible range [0, 1]
		m_texFormatInfo.lookupBias = Vec4(0.25f, 0.0f, 0.0f, 1.0f);
		m_texFormatInfo.lookupScale = Vec4(0.5f, 1.0f, 1.0f, 0.0f);
	}